

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Common.cpp
# Opt level: O2

bool __thiscall
psy::C::Parser::parseParenthesizedTypeNameOrExpression(Parser *this,TypeReferenceSyntax **tyRef)

{
  bool bVar1;
  SyntaxKind SVar2;
  SyntaxToken *pSVar3;
  ExpressionAsTypeReferenceSyntax *pEVar4;
  IndexType IVar5;
  TypeNameAsTypeReferenceSyntax *pTVar6;
  TypeNameSyntax *typeName;
  ExpressionSyntax *expr;
  Backtracker BT;
  
  pSVar3 = peek(this,1);
  if (pSVar3->syntaxK_ == OpenParenToken) {
    Backtracker::Backtracker(&BT,this,0);
    expr = (ExpressionSyntax *)0x0;
    bVar1 = parseExpressionWithPrecedenceUnary(this,&expr);
    if (bVar1) {
      pEVar4 = makeNode<psy::C::ExpressionAsTypeReferenceSyntax>(this);
      *tyRef = &pEVar4->super_TypeReferenceSyntax;
      pEVar4->expr_ = expr;
      SVar2 = C::SyntaxNode::kind(&expr->super_SyntaxNode);
      bVar1 = true;
      if (SVar2 == ParenthesizedExpression) {
        maybeAmbiguateTypeReference(this,tyRef);
      }
    }
    else {
      Backtracker::backtrack(&BT);
      IVar5 = consume(this);
      typeName = (TypeNameSyntax *)0x0;
      bVar1 = parseTypeName(this,&typeName);
      if (bVar1) {
        pTVar6 = makeNode<psy::C::TypeNameAsTypeReferenceSyntax>(this);
        *tyRef = &pTVar6->super_TypeReferenceSyntax;
        pTVar6->openParenTkIdx_ = IVar5;
        pTVar6->typeName_ = typeName;
        bVar1 = matchOrSkipTo(this,CloseParenToken,&pTVar6->closeParenTkIdx_);
      }
      else {
        bVar1 = false;
      }
    }
    Backtracker::~Backtracker(&BT);
  }
  else {
    BT.parser_ = (Parser *)0x0;
    bVar1 = parseExpressionWithPrecedenceUnary(this,(ExpressionSyntax **)&BT);
    if (bVar1) {
      pEVar4 = makeNode<psy::C::ExpressionAsTypeReferenceSyntax>(this);
      *tyRef = &pEVar4->super_TypeReferenceSyntax;
      pEVar4->expr_ = (ExpressionSyntax *)BT.parser_;
    }
  }
  return bVar1;
}

Assistant:

bool Parser::parseParenthesizedTypeNameOrExpression(TypeReferenceSyntax*& tyRef)
{
    switch (peek().kind()) {
        case SyntaxKind::OpenParenToken: {
            Backtracker BT(this);
            ExpressionSyntax* expr = nullptr;
            if (parseExpressionWithPrecedenceUnary(expr)) {
                auto exprAsTyRef = makeNode<ExpressionAsTypeReferenceSyntax>();
                tyRef = exprAsTyRef;
                exprAsTyRef->expr_ = expr;
                if (expr->kind() == SyntaxKind::ParenthesizedExpression)
                    maybeAmbiguateTypeReference(tyRef);
                return true;
            }

            BT.backtrack();
            auto openParenTkIdx = consume();
            TypeNameSyntax* typeName = nullptr;
            if (!parseTypeName(typeName))
                return false;

            auto nameAsTyRef = makeNode<TypeNameAsTypeReferenceSyntax>();
            tyRef = nameAsTyRef;
            nameAsTyRef->openParenTkIdx_ = openParenTkIdx;
            nameAsTyRef->typeName_ = typeName;
            return matchOrSkipTo(SyntaxKind::CloseParenToken, &nameAsTyRef->closeParenTkIdx_);
        }

        default: {
            ExpressionSyntax* unaryExpr = nullptr;
            if (!parseExpressionWithPrecedenceUnary(unaryExpr))
                return false;
            auto exprAsTyRef = makeNode<ExpressionAsTypeReferenceSyntax>();
            tyRef = exprAsTyRef;
            exprAsTyRef->expr_ = unaryExpr;
            return true;
        }
    }
}